

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  TransformerLinLin *pTVar3;
  bool bVar4;
  ImVec2 IVar5;
  bool local_f2;
  bool local_f1;
  ImVec2 intersection;
  int intersect;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect rect;
  ImVec2 local_58;
  ImVec2 P22;
  ImVec2 local_3c;
  ImVec2 P21;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  *this_local;
  
  pTVar3 = this->Transformer;
  P21.x = (float)prim;
  unique0x100004d3 = uv;
  _P22 = GetterYs<long_long>::operator()(this->Getter1,prim + 1);
  local_3c = TransformerLinLin::operator()(pTVar3,(ImPlotPoint *)&P22);
  pTVar3 = this->Transformer;
  join_0x00001240_0x00001200_ = GetterYRef::operator()(this->Getter2,(int)P21.x + 1);
  local_58 = TransformerLinLin::operator()(pTVar3,(ImPlotPoint *)&rect.Max);
  local_90 = ImMin(&this->P11,&this->P12);
  local_88 = ImMin(&local_90,&local_3c);
  local_80 = ImMin(&local_88,&local_58);
  register0x00001200 = ImMax(&this->P11,&this->P12);
  local_a0 = ImMax((ImVec2 *)&intersection.y,&local_3c);
  local_98 = ImMax(&local_a0,&local_58);
  ImRect::ImRect((ImRect *)local_78,&local_80,&local_98);
  bVar4 = ImRect::Overlaps(cull_rect,(ImRect *)local_78);
  if (bVar4) {
    fVar2 = (this->P11).y;
    pfVar1 = &(this->P12).y;
    if ((fVar2 < *pfVar1 || fVar2 == *pfVar1) || (local_f1 = true, local_58.y <= local_3c.y)) {
      fVar2 = (this->P12).y;
      pfVar1 = &(this->P11).y;
      local_f2 = (*pfVar1 <= fVar2 && fVar2 != *pfVar1) && local_58.y < local_3c.y;
      local_f1 = local_f2;
    }
    intersection.x = (float)(uint)local_f1;
    IVar5 = Intersection(&this->P11,&local_3c,&this->P12,&local_58);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *stack0xffffffffffffffd0;
    DrawList->_VtxWritePtr->col = this->Col;
    DrawList->_VtxWritePtr[1].pos = local_3c;
    DrawList->_VtxWritePtr[1].uv = *stack0xffffffffffffffd0;
    DrawList->_VtxWritePtr[1].col = this->Col;
    DrawList->_VtxWritePtr[2].pos = IVar5;
    DrawList->_VtxWritePtr[2].uv = *stack0xffffffffffffffd0;
    DrawList->_VtxWritePtr[2].col = this->Col;
    DrawList->_VtxWritePtr[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *stack0xffffffffffffffd0;
    DrawList->_VtxWritePtr[3].col = this->Col;
    DrawList->_VtxWritePtr[4].pos = local_58;
    DrawList->_VtxWritePtr[4].uv = *stack0xffffffffffffffd0;
    DrawList->_VtxWritePtr[4].col = this->Col;
    DrawList->_VtxWritePtr = DrawList->_VtxWritePtr + 5;
    *DrawList->_IdxWritePtr = (ImDrawIdx)DrawList->_VtxCurrentIdx;
    DrawList->_IdxWritePtr[1] = (short)DrawList->_VtxCurrentIdx + 1 + SUB42(intersection.x,0);
    DrawList->_IdxWritePtr[2] = (short)DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr[3] = (short)DrawList->_VtxCurrentIdx + 1;
    DrawList->_IdxWritePtr[4] = ((short)DrawList->_VtxCurrentIdx + 3) - SUB42(intersection.x,0);
    DrawList->_IdxWritePtr[5] = (short)DrawList->_VtxCurrentIdx + 4;
    DrawList->_IdxWritePtr = DrawList->_IdxWritePtr + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
    this->P11 = local_3c;
    this->P12 = local_58;
    this_local._7_1_ = true;
  }
  else {
    this->P11 = local_3c;
    this->P12 = local_58;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }